

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trace.h
# Opt level: O3

void __thiscall NULLC::TraceContext::TraceContext(TraceContext *this)

{
  TraceScopeToken *pTVar1;
  long lVar2;
  char *pcVar3;
  TraceEvent *pTVar4;
  
  (this->output).outputBuf = (char *)this;
  (this->output).outputBufSize = 0x100;
  (this->output).outputBufPos = 0;
  (this->output).tempBuf = (this->output).tempBufDef;
  (this->output).tempBufSize = 0x100;
  (this->output).stream = (void *)0x0;
  (this->output).openStream = OutputContext::FileOpen;
  (this->output).writeStream = OutputContext::FileWrite;
  (this->output).closeStream = OutputContext::FileClose;
  (this->scopeTokens).count = 0;
  (this->scopeTokens).max = 0x400;
  pTVar1 = (TraceScopeToken *)operator_new__(0x4000);
  lVar2 = 0;
  do {
    *(char **)((long)&pTVar1->category + lVar2) = "";
    *(char **)((long)&pTVar1->name + lVar2) = "";
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x4000);
  (this->scopeTokens).data = pTVar1;
  (this->labels).count = 0;
  (this->labels).max = 0x2000;
  pcVar3 = (char *)operator_new__(0x2000);
  (this->labels).data = pcVar3;
  (this->events).count = 0;
  (this->events).max = 0x2000;
  pTVar4 = (TraceEvent *)operator_new__(0x10000);
  (this->events).data = pTVar4;
  this->outputEnabled = false;
  this->needComma = false;
  this->openEvent = false;
  this->depth = 0;
  this->outputDepth = 0;
  (this->outputBuf).count = 0;
  (this->outputBuf).max = 0;
  (this->outputBuf).data = (char *)0x0;
  (this->tempBuf).count = 0;
  (this->tempBuf).max = 0;
  (this->tempBuf).data = (char *)0x0;
  return;
}

Assistant:

TraceContext(): scopeTokens(1024), labels(8192), events(8192), outputBuf(0), tempBuf(0)
		{
			outputEnabled = false;

			needComma = false;
			openEvent = false;
			depth = 0;
			outputDepth = 0;
		}